

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O1

path * __thiscall mp::path::filename(path *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  long lVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar2 == -1) {
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    pcVar1 = (this->str_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->str_)._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path filename() const {
    size_t last_sep = FindLastSep();
    return last_sep == std::string::npos ?
        *this : path(str_.substr(last_sep + 1));
  }